

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  FilePath *in_RDI;
  FilePath local_50;
  undefined1 local_30 [8];
  FilePath result;
  
  FilePath::FilePath((FilePath *)local_30);
  FilePath::FilePath(&local_50,(string *)g_executable_path_abi_cxx11_);
  FilePath::Set((FilePath *)local_30,&local_50);
  FilePath::~FilePath(&local_50);
  FilePath::RemoveDirectoryName(in_RDI,(FilePath *)local_30);
  FilePath::~FilePath((FilePath *)local_30);
  return in_RDI;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS
  result.Set(FilePath(g_executable_path).RemoveExtension("exe"));
#else
  result.Set(FilePath(g_executable_path));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}